

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
::
nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::__cxx11::string&,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,try_emplace_args_t *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>
          *args_2)

{
  group_type_pointer pgVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  uint uVar6;
  ushort uVar7;
  long lVar8;
  undefined1 auVar9 [16];
  
  uVar3 = arrays_->groups_size_mask;
  pgVar4 = arrays_->groups_;
  lVar8 = 1;
  while( true ) {
    pgVar1 = pgVar4 + pos0;
    auVar2 = pgVar4[pos0].m[0].n;
    auVar9[0] = -(auVar2[0] == '\0');
    auVar9[1] = -(auVar2[1] == '\0');
    auVar9[2] = -(auVar2[2] == '\0');
    auVar9[3] = -(auVar2[3] == '\0');
    auVar9[4] = -(auVar2[4] == '\0');
    auVar9[5] = -(auVar2[5] == '\0');
    auVar9[6] = -(auVar2[6] == '\0');
    auVar9[7] = -(auVar2[7] == '\0');
    auVar9[8] = -(auVar2[8] == '\0');
    auVar9[9] = -(auVar2[9] == '\0');
    auVar9[10] = -(auVar2[10] == '\0');
    auVar9[0xb] = -(auVar2[0xb] == '\0');
    auVar9[0xc] = -(auVar2[0xc] == '\0');
    auVar9[0xd] = -(auVar2[0xd] == '\0');
    auVar9[0xe] = -(auVar2[0xe] == '\0');
    auVar9[0xf] = -(auVar2[0xf] == 0);
    uVar7 = (ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe;
    if (uVar7 != 0) break;
    pgVar1->m[0xf].n = auVar2[0xf] | '\x01' << ((byte)hash & 7);
    pos0 = pos0 + lVar8 & uVar3;
    lVar8 = lVar8 + 1;
  }
  uVar6 = 0;
  if (uVar7 != 0) {
    for (; (uVar7 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
    }
  }
  ppVar5 = arrays_->elements_;
  construct_element_from_try_emplace_args<std::__cxx11::string&,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>
            (this,ppVar5 + pos0 * 0xf + (ulong)uVar6,args_1,args_2);
  pgVar1->m[uVar6].n =
       *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word + (hash & 0xff));
  __return_storage_ptr__->pg = pgVar1;
  __return_storage_ptr__->n = uVar6;
  __return_storage_ptr__->p = ppVar5 + pos0 * 0xf + (ulong)uVar6;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }